

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_base.c
# Opt level: O0

int zt_base_decode(zt_base_definition_t *def,void *in,size_t in_bytes,void **out,size_t *out_bytes)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  long *in_RCX;
  size_t in_RDX;
  uchar *in_RSI;
  zt_base_definition_t *in_RDI;
  size_t *in_R8;
  ssize_t i;
  size_t mod;
  size_t ocount;
  size_t lcount;
  uchar *outp;
  uchar *inp;
  size_t in_stack_ffffffffffffff98;
  uchar *local_40;
  int local_4;
  
  iVar1 = _valid_dictionary_p(in_RDI);
  if (iVar1 == 0) {
    local_4 = -1;
  }
  else if (in_R8 == (size_t *)0x0) {
    local_4 = -1;
  }
  else if ((in_RSI == (uchar *)0x0) || (in_RDX == 0)) {
    *in_R8 = 0;
    local_4 = 0;
  }
  else {
    for (sVar2 = in_RDX - 1; 0 < (long)sVar2; sVar2 = sVar2 - 1) {
      if ((uint)in_RSI[sVar2] != (int)in_RDI->pad) {
        sVar2 = (in_RDX - 1) - sVar2;
        break;
      }
    }
    uVar3 = ((in_RDX - sVar2) / (ulong)in_RDI->ogroups) * (ulong)in_RDI->igroups +
            (in_RDX - sVar2) % (ulong)in_RDI->ogroups;
    if (in_RCX == (long *)0x0) {
      *in_R8 = uVar3;
      local_4 = 0;
    }
    else if ((*in_RCX == 0) || (uVar3 <= *in_R8)) {
      local_40 = (uchar *)*in_RCX;
      if ((local_40 == (uchar *)0x0) && (*in_R8 == 0)) {
        local_40 = (uchar *)zt_calloc_p(sVar2,in_stack_ffffffffffffff98);
        if (local_40 == (uchar *)0x0) {
          return -1;
        }
        *in_RCX = (long)local_40;
        *in_R8 = uVar3;
      }
      sVar2 = in_RDI->base;
      if (sVar2 == 0x10) {
        local_4 = _decode16(in_RDI,in_RSI,in_RDX,local_40,in_R8);
      }
      else if (sVar2 == 0x20) {
        local_4 = _decode32(in_RDI,in_RSI,in_RDX,local_40,in_R8);
      }
      else if (sVar2 == 0x40) {
        local_4 = _decode64(in_RDI,in_RSI,in_RDX,local_40,in_R8);
      }
      else {
        local_4 = -1;
      }
    }
    else {
      *in_R8 = uVar3;
      local_4 = -2;
    }
  }
  return local_4;
}

Assistant:

int
zt_base_decode(zt_base_definition_t * def, const void * in, size_t in_bytes, void ** out, size_t * out_bytes) {
    const unsigned char * inp;
    unsigned char       * outp;
    size_t                lcount = 0;
    size_t                ocount = 0;
    size_t                mod = 0;
	ssize_t               i;

    if (!_valid_dictionary_p(def)) {
        return -1;
    }

    if (!out_bytes) {
        return -1;
    }

    if (!in || !in_bytes) {
        *out_bytes = 0;
        return 0;
    }

    inp  = (unsigned char *)in;

    /* strip any follow on pad chars */
    for (i=in_bytes-1; i > 0; i--) {
        if (inp[i] != def->pad) {
            i = in_bytes - 1 - i;
            break;
        }
    }

    lcount = (in_bytes-i) / def->ogroups; /* number of whole input groups */
    mod = ((in_bytes-i) % def->ogroups); /* partial inputs */
    ocount = (lcount * def->igroups) + mod; /* total output bytes */

    if (out == NULL) {
        *out_bytes = ocount;
        return 0;
    }

    if (*out != NULL && *out_bytes < ocount) {
        *out_bytes = ocount;
        return -2;
    }

    outp = *((unsigned char **)out);

    if ((outp == NULL && *out_bytes == 0)) {
        /* dynamically allocate the buffer */
        if (!(outp = zt_calloc(unsigned char, ocount+1))) {
            return -1;
        }

        *out = outp;
        *out_bytes = ocount;
    }

    switch(def->base) {
        case 64:
            return _decode64(def, inp, in_bytes, outp, out_bytes);
            break;
        case 32:
            return _decode32(def, inp, in_bytes, outp, out_bytes);
            break;
        case 16:
            return _decode16(def, inp, in_bytes, outp, out_bytes);
            break;
        default:
            break;
    }

    return -1;
}